

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

Snapshot * __thiscall cmState::Reset(Snapshot *__return_storage_ptr__,cmState *this)

{
  iterator *piVar1;
  StackIter begin;
  StackIter begin_00;
  StackIter end;
  StackIter end_00;
  bool bVar2;
  PointerType pBVar3;
  PointerType pSVar4;
  char *pcVar5;
  PointerType pcVar6;
  iterator iVar7;
  allocator local_2d9;
  string local_2d8;
  allocator local_2b1;
  string local_2b0;
  allocator local_289;
  string local_288;
  allocator local_261;
  string local_260;
  allocator local_239;
  string local_238;
  allocator local_211;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  iterator local_1a0;
  iterator local_190;
  iterator local_180;
  iterator local_170;
  allocator local_159;
  cmLinkedTree<cmDefinitions> *local_158;
  PositionType PStack_150;
  cmLinkedTree<cmDefinitions> *local_148;
  PositionType PStack_140;
  allocator local_131;
  string local_130;
  string local_110 [8];
  string binDir;
  allocator local_b1;
  string local_b0;
  string local_90 [8];
  string srcDir;
  PositionType local_68;
  cmLinkedTree<cmState::PolicyStackEntry> *local_60;
  PositionType local_58;
  cmLinkedTree<cmState::PolicyStackEntry> *local_50;
  PositionType local_48;
  undefined1 local_40 [8];
  iterator it;
  undefined1 local_20 [8];
  PositionType pos;
  cmState *this_local;
  
  pos.Position = (PositionType)this;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ::clear(&(this->GlobalProperties).
           super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
         );
  std::
  map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
  ::clear(&this->PropertyDefinitions);
  _local_20 = cmLinkedTree<cmState::SnapshotDataType>::Truncate(&this->SnapshotData);
  join_0x00000010_0x00000000_ =
       cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::Truncate(&this->ExecutionListFiles);
  _local_40 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::Truncate
                        (&this->BuildsystemDirectory);
  pBVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&pBVar3->IncludeDirectories);
  pBVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_40);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
            (&pBVar3->IncludeDirectoryBacktraces);
  pBVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&pBVar3->CompileDefinitions);
  pBVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_40);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
            (&pBVar3->CompileDefinitionsBacktraces);
  pBVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&pBVar3->CompileOptions);
  pBVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_40);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
            (&pBVar3->CompileOptionsBacktraces);
  pBVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_40);
  (pBVar3->DirectoryEnd).Tree = (cmLinkedTree<cmState::SnapshotDataType> *)local_20;
  (pBVar3->DirectoryEnd).Position = (PositionType)pos.Tree;
  pBVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_40);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ::clear(&(pBVar3->Properties).
           super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
         );
  pBVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_40);
  std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::clear(&pBVar3->Children);
  cmLinkedTree<cmState::PolicyStackEntry>::Clear(&this->PolicyStack);
  iVar7 = cmLinkedTree<cmState::PolicyStackEntry>::Root(&this->PolicyStack);
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  local_50 = iVar7.Tree;
  (pSVar4->Policies).Tree = local_50;
  local_48 = iVar7.Position;
  (pSVar4->Policies).Position = local_48;
  iVar7 = cmLinkedTree<cmState::PolicyStackEntry>::Root(&this->PolicyStack);
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  local_60 = iVar7.Tree;
  (pSVar4->PolicyRoot).Tree = local_60;
  local_58 = iVar7.Position;
  (pSVar4->PolicyRoot).Position = local_58;
  join_0x00000010_0x00000000_ = cmLinkedTree<cmState::PolicyStackEntry>::Root(&this->PolicyStack);
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  (pSVar4->PolicyScope).Tree = (cmLinkedTree<cmState::PolicyStackEntry> *)srcDir.field_2._8_8_;
  (pSVar4->PolicyScope).Position = local_68;
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  bVar2 = cmLinkedTree<cmState::PolicyStackEntry>::iterator::IsValid(&pSVar4->Policies);
  if (!bVar2) {
    __assert_fail("pos->Policies.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                  ,0x150,"cmState::Snapshot cmState::Reset()");
  }
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  bVar2 = cmLinkedTree<cmState::PolicyStackEntry>::iterator::IsValid(&pSVar4->PolicyRoot);
  if (!bVar2) {
    __assert_fail("pos->PolicyRoot.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                  ,0x151,"cmState::Snapshot cmState::Reset()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"CMAKE_SOURCE_DIR",&local_b1);
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  begin_00.Tree = (pSVar4->Vars).Tree;
  begin_00.Position = (pSVar4->Vars).Position;
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  end.Tree = (pSVar4->Root).Tree;
  end.Position = (pSVar4->Root).Position;
  pcVar5 = cmDefinitions::Get(&local_b0,begin_00,end);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,pcVar5,(allocator *)(binDir.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(binDir.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"CMAKE_BINARY_DIR",&local_131);
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  local_148 = (pSVar4->Vars).Tree;
  PStack_140 = (pSVar4->Vars).Position;
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  piVar1 = &pSVar4->Root;
  local_158 = piVar1->Tree;
  PStack_150 = (pSVar4->Root).Position;
  end_00.Tree = piVar1->Tree;
  end_00.Position = piVar1->Position;
  begin.Position = PStack_140;
  begin.Tree = local_148;
  pcVar5 = cmDefinitions::Get(&local_130,begin,end_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,pcVar5,&local_159);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  cmLinkedTree<cmDefinitions>::Clear(&this->VarTree);
  local_180 = cmLinkedTree<cmDefinitions>::Root(&this->VarTree);
  local_170 = cmLinkedTree<cmDefinitions>::Push(&this->VarTree,local_180);
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  pSVar4->Vars = local_170;
  local_190 = cmLinkedTree<cmDefinitions>::Root(&this->VarTree);
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  pSVar4->Parent = local_190;
  local_1a0 = cmLinkedTree<cmDefinitions>::Root(&this->VarTree);
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  pSVar4->Root = local_1a0;
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  pcVar6 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c0,"CMAKE_SOURCE_DIR",&local_1c1);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmDefinitions::Set(pcVar6,&local_1c0,pcVar5);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  pcVar6 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e8,"CMAKE_BINARY_DIR",&local_1e9);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmDefinitions::Set(pcVar6,&local_1e8,pcVar5);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_210,"RULE_LAUNCH_COMPILE",&local_211);
  DefineProperty(this,&local_210,DIRECTORY,"","",true);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_238,"RULE_LAUNCH_LINK",&local_239);
  DefineProperty(this,&local_238,DIRECTORY,"","",true);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_260,"RULE_LAUNCH_CUSTOM",&local_261);
  DefineProperty(this,&local_260,DIRECTORY,"","",true);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_288,"RULE_LAUNCH_COMPILE",&local_289);
  DefineProperty(this,&local_288,TARGET,"","",true);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b0,"RULE_LAUNCH_LINK",&local_2b1);
  DefineProperty(this,&local_2b0,TARGET,"","",true);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2d8,"RULE_LAUNCH_CUSTOM",&local_2d9);
  DefineProperty(this,&local_2d8,TARGET,"","",true);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  Snapshot::Snapshot(__return_storage_ptr__,this,_local_20);
  return __return_storage_ptr__;
}

Assistant:

cmState::Snapshot cmState::Reset()
{
  this->GlobalProperties.clear();
  this->PropertyDefinitions.clear();

  PositionType pos = this->SnapshotData.Truncate();
  this->ExecutionListFiles.Truncate();

  {
  cmLinkedTree<BuildsystemDirectoryStateType>::iterator it =
      this->BuildsystemDirectory.Truncate();
  it->IncludeDirectories.clear();
  it->IncludeDirectoryBacktraces.clear();
  it->CompileDefinitions.clear();
  it->CompileDefinitionsBacktraces.clear();
  it->CompileOptions.clear();
  it->CompileOptionsBacktraces.clear();
  it->DirectoryEnd = pos;
  it->Properties.clear();
  it->Children.clear();
  }

  this->PolicyStack.Clear();
  pos->Policies = this->PolicyStack.Root();
  pos->PolicyRoot = this->PolicyStack.Root();
  pos->PolicyScope = this->PolicyStack.Root();
  assert(pos->Policies.IsValid());
  assert(pos->PolicyRoot.IsValid());

  {
  std::string srcDir =
      cmDefinitions::Get("CMAKE_SOURCE_DIR", pos->Vars, pos->Root);
  std::string binDir =
      cmDefinitions::Get("CMAKE_BINARY_DIR", pos->Vars, pos->Root);
  this->VarTree.Clear();
  pos->Vars = this->VarTree.Push(this->VarTree.Root());
  pos->Parent = this->VarTree.Root();
  pos->Root = this->VarTree.Root();

  pos->Vars->Set("CMAKE_SOURCE_DIR", srcDir.c_str());
  pos->Vars->Set("CMAKE_BINARY_DIR", binDir.c_str());
  }

  this->DefineProperty
    ("RULE_LAUNCH_COMPILE", cmProperty::DIRECTORY,
     "", "", true);
  this->DefineProperty
    ("RULE_LAUNCH_LINK", cmProperty::DIRECTORY,
     "", "", true);
  this->DefineProperty
    ("RULE_LAUNCH_CUSTOM", cmProperty::DIRECTORY,
     "", "", true);

  this->DefineProperty
    ("RULE_LAUNCH_COMPILE", cmProperty::TARGET,
     "", "", true);
  this->DefineProperty
    ("RULE_LAUNCH_LINK", cmProperty::TARGET,
     "", "", true);
  this->DefineProperty
    ("RULE_LAUNCH_CUSTOM", cmProperty::TARGET,
     "", "", true);

  return Snapshot(this, pos);
}